

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O1

void __thiscall defyx::JitCompilerX86::h_IMUL_RCP(JitCompilerX86 *this,Instruction *instr,int i)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  int iVar3;
  undefined8 uVar4;
  
  if ((instr->imm32 & instr->imm32 - 1) != 0) {
    this->registerUsage[instr->dst] = i;
    puVar1 = this->code;
    iVar3 = this->codePos;
    (puVar1 + iVar3)[0] = 'H';
    (puVar1 + iVar3)[1] = 0xb8;
    this->codePos = this->codePos + 2;
    uVar4 = defyx_reciprocal_fast();
    *(undefined8 *)(this->code + this->codePos) = uVar4;
    iVar3 = this->codePos + 8;
    this->codePos = iVar3;
    puVar2 = this->code;
    puVar1 = puVar2 + iVar3;
    puVar1[0] = 'L';
    puVar1[1] = '\x0f';
    puVar2[(long)iVar3 + 2] = 0xaf;
    iVar3 = this->codePos + 3;
    this->codePos = iVar3;
    this->code[iVar3] = instr->dst * '\b' + 0xc0;
    this->codePos = this->codePos + 1;
  }
  return;
}

Assistant:

void JitCompilerX86::h_IMUL_RCP(Instruction& instr, int i) {
		uint64_t divisor = instr.getImm32();
		if (!isZeroOrPowerOf2(divisor)) {
			registerUsage[instr.dst] = i;
			emit(MOV_RAX_I);
			emit64(defyx_reciprocal_fast(divisor));
			emit(REX_IMUL_RM);
			emitByte(0xc0 + 8 * instr.dst);
		}
	}